

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_settable_totop(lua_State *L,CallInfo *ci,TValue *ra,TValue *first_val,int start)

{
  double dVar1;
  LuaType LVar2;
  Table *t;
  RaviArray *t_00;
  undefined8 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  lua_Integer value;
  uint nasize;
  char *pcVar6;
  uint ukey;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  TValue *pTVar10;
  double dVar11;
  lua_Number value_00;
  undefined1 auVar12 [16];
  
  LVar2 = ra->tt_;
  uVar7 = (uint)((ulong)((long)L->top - (long)first_val) >> 4);
  if ((LVar2 == 0x8025) || (LVar2 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar6 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0014823c;
    }
    if (0 < (int)uVar7) {
      uVar8 = (ulong)start;
      pTVar10 = first_val + (uVar8 - 1);
      do {
        LVar2 = pTVar10->tt_;
        if ((t_00->flags & 8) == 0) {
          if (LVar2 == 0x13) {
            value = (pTVar10->value_).i;
          }
          else {
            if (pTVar10->tt_ == 0x13) {
              value = (pTVar10->value_).i;
              uVar5 = 0;
            }
            else {
              uVar5 = 1;
              if (pTVar10->tt_ == 3) {
                dVar1 = (pTVar10->value_).n;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = dVar1;
                auVar12 = vroundsd_avx(auVar12,auVar12,9);
                dVar11 = auVar12._0_8_;
                if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
                  uVar3 = vcmppd_avx512vl(auVar12,ZEXT816(0x43e0000000000000),5);
                  uVar4 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar12,6);
                  uVar5 = (ushort)uVar4 & 3 | (ushort)uVar3 & 3;
                  if ((uVar5 & 1) == 0) {
                    value = (lua_Integer)dVar11;
                  }
                  else {
                    value = 0;
                  }
                  goto LAB_001481af;
                }
              }
              value = 0;
            }
LAB_001481af:
            if ((uVar5 & 1) != 0) {
              pcVar6 = "value cannot be converted to integer";
LAB_00148203:
              luaG_runerror(L,pcVar6);
            }
          }
          if ((uint)uVar8 < t_00->len) {
            *(lua_Integer *)(t_00->data + (uVar8 & 0xffffffff) * 8) = value;
          }
          else {
            raviH_set_int(L,t_00,uVar8 & 0xffffffff,value);
          }
        }
        else {
          if (LVar2 == 0x13) {
            value_00 = (lua_Number)(pTVar10->value_).i;
          }
          else {
            if (LVar2 != 3) {
              pcVar6 = "value cannot be converted to number";
              goto LAB_00148203;
            }
            value_00 = (pTVar10->value_).n;
          }
          if ((uint)uVar8 < t_00->len) {
            *(lua_Number *)(t_00->data + (uVar8 & 0xffffffff) * 8) = value_00;
          }
          else {
            raviH_set_float(L,t_00,uVar8 & 0xffffffff,value_00);
          }
        }
        uVar8 = uVar8 + 1;
        pTVar10 = pTVar10 + 1;
      } while ((long)uVar8 < (long)(int)(uVar7 + start));
    }
  }
  else {
    if (LVar2 != 0x8005) {
      pcVar6 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0014823c:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb43,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb39,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    nasize = (uVar7 - 1) + start;
    if (t->sizearray < nasize) {
      luaH_resizearray(L,t,nasize);
    }
    if (0 < (int)uVar7) {
      lVar9 = (ulong)(uVar7 & 0x7fffffff) + 1;
      pTVar10 = first_val + ((ulong)(uVar7 & 0x7fffffff) - 1);
      do {
        luaH_setint(L,t,(ulong)nasize,pTVar10);
        if ((short)pTVar10->tt_ < 0) {
          if (9 < (t->tt & 0xe)) {
            __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb3f,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          if (((t->marked & 0x20) != 0) && ((((pTVar10->value_).gc)->marked & 0x18) != 0)) {
            luaC_barrierback_(L,(GCObject *)t);
          }
        }
        lVar9 = lVar9 + -1;
        pTVar10 = pTVar10 + -1;
        nasize = nasize - 1;
      } while (1 < lVar9);
    }
  }
  return;
}

Assistant:

void raviV_op_settable_totop(lua_State *L, CallInfo *ci, TValue *ra, TValue *first_val, int start) {
  unsigned int last;
  int n = cast_int(L->top - first_val);
  last = start + n - 1;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = first_val + n - 1;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = start;
    for (; i <= (int)last; i++) {
      TValue *val = first_val + i - 1;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  //L->top = ci->top; /* correct top (in case of previous open call) */
}